

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderMaxPatchVertices::deinit(TessellationShaderMaxPatchVertices *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  float default_levels [4];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long lVar3;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    if (this->m_patch_vertices_f != (GLfloat *)0x0) {
      free(this->m_patch_vertices_f);
      this->m_patch_vertices_f = (GLfloat *)0x0;
    }
    if (this->m_patch_vertices_i != (GLint *)0x0) {
      free(this->m_patch_vertices_i);
      this->m_patch_vertices_i = (GLint *)0x0;
    }
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x1680))(0);
    (**(code **)(lVar3 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    uVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar2 & 0x300) != 0) {
      local_28 = 0x3f800000;
      uStack_24 = 0x3f800000;
      uStack_20 = 0x3f800000;
      uStack_1c = 0x3f800000;
      (**(code **)(lVar3 + 0xfd0))(0x8e73,&local_28);
      (**(code **)(lVar3 + 0xfd0))(0x8e74,&local_28);
    }
    (**(code **)(lVar3 + 0x518))(0);
    (**(code **)(lVar3 + 0x518))(1);
    (**(code **)(lVar3 + 0x40))(0x8c8e,0);
    (**(code **)(lVar3 + 0x48))(0x8c8e,0,0);
    (**(code **)(lVar3 + 0x48))(0x8c8e,1,0);
    (**(code **)(lVar3 + 0xd0))(0x8e22,0);
    (**(code **)(lVar3 + 0x4e8))(0x8c89);
    (**(code **)(lVar3 + 0xd8))(0);
    if (this->m_bo_id_f_1 != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id_f_1);
      this->m_bo_id_f_1 = 0;
    }
    if (this->m_bo_id_f_2 != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id_f_2);
      this->m_bo_id_f_2 = 0;
    }
    if (this->m_bo_id_i_1 != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id_i_1);
      this->m_bo_id_i_1 = 0;
    }
    if (this->m_bo_id_i_2 != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_bo_id_i_2);
      this->m_bo_id_i_2 = 0;
    }
    if (this->m_patch_vertices_bo_f_id != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_patch_vertices_bo_f_id);
      this->m_patch_vertices_bo_f_id = 0;
    }
    if (this->m_patch_vertices_bo_i_id != 0) {
      (**(code **)(lVar3 + 0x438))(1,&this->m_patch_vertices_bo_i_id);
      this->m_patch_vertices_bo_i_id = 0;
    }
    if (this->m_vs_id != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_vs_id = 0;
    }
    if (this->m_tc_id != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_tc_id = 0;
    }
    if (this->m_te_id != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_te_id = 0;
    }
    if (this->m_fs_id != 0) {
      (**(code **)(lVar3 + 0x470))();
      this->m_fs_id = 0;
    }
    if (this->m_tf_id_1 != 0) {
      (**(code **)(lVar3 + 0x488))(1,&this->m_tf_id_1);
      this->m_tf_id_1 = 0;
    }
    if (this->m_tf_id_2 != 0) {
      (**(code **)(lVar3 + 0x488))(1,&this->m_tf_id_2);
      this->m_tf_id_2 = 0;
    }
    if (this->m_po_id_1 != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_po_id_1 = 0;
    }
    if (this->m_po_id_2 != 0) {
      (**(code **)(lVar3 + 0x448))();
      this->m_po_id_2 = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
  }
  return;
}

Assistant:

void TessellationShaderMaxPatchVertices::deinit(void)
{
	/* Deinitialize parent. */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	/* Dealocate input array of patch vertices. */
	if (m_patch_vertices_f != DE_NULL)
	{
		free(m_patch_vertices_f);

		m_patch_vertices_f = DE_NULL;
	}

	if (m_patch_vertices_i != DE_NULL)
	{
		free(m_patch_vertices_i);

		m_patch_vertices_i = DE_NULL;
	}

	/* Retrieve ES entry-points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set back to default program */
	gl.useProgram(0);

	/* Revert GL_PATCH_VERTICES_EXT value to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Revert GL_PATCH_DEFAULT_INNER_LEVEL and GL_PATCH_DEFAULT_OUTER_LEVEL pname
		 * values to the default settings */
		const float default_levels[] = { 1.0f, 1.0f, 1.0f, 1.0f };

		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, default_levels);
		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, default_levels);
	}

	/* Disable vertex attribute arrays that may have been enabled for the test */
	gl.disableVertexAttribArray(0);
	gl.disableVertexAttribArray(1);

	/* Unbind buffer objects from TF binding points */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1 /* index */, 0 /* buffer */);

	/* Unbind transform feedback object */
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0 /* id */);

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Delete OpenGL objects */
	if (m_bo_id_f_1 != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_f_1);

		m_bo_id_f_1 = 0;
	}

	if (m_bo_id_f_2 != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_f_2);

		m_bo_id_f_2 = 0;
	}

	if (m_bo_id_i_1 != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_i_1);

		m_bo_id_i_1 = 0;
	}

	if (m_bo_id_i_2 != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_i_2);

		m_bo_id_i_2 = 0;
	}

	if (m_patch_vertices_bo_f_id != 0)
	{
		gl.deleteBuffers(1, &m_patch_vertices_bo_f_id);

		m_patch_vertices_bo_f_id = 0;
	}

	if (m_patch_vertices_bo_i_id != 0)
	{
		gl.deleteBuffers(1, &m_patch_vertices_bo_i_id);

		m_patch_vertices_bo_i_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	if (m_tc_id != 0)
	{
		gl.deleteShader(m_tc_id);

		m_tc_id = 0;
	}

	if (m_te_id != 0)
	{
		gl.deleteShader(m_te_id);

		m_te_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_tf_id_1 != 0)
	{
		gl.deleteTransformFeedbacks(1, &m_tf_id_1);

		m_tf_id_1 = 0;
	}

	if (m_tf_id_2 != 0)
	{
		gl.deleteTransformFeedbacks(1, &m_tf_id_2);

		m_tf_id_2 = 0;
	}

	if (m_po_id_1 != 0)
	{
		gl.deleteProgram(m_po_id_1);

		m_po_id_1 = 0;
	}

	if (m_po_id_2 != 0)
	{
		gl.deleteProgram(m_po_id_2);

		m_po_id_2 = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}